

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O0

ValueFunctionPOMDPDiscrete * AlphaVectorPruning::ParetoPrune(ValueFunctionPOMDPDiscrete *Vin)

{
  bool bVar1;
  size_type sVar2;
  reference y;
  ulong uVar3;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *pvVar4;
  AlphaVector *in_RDI;
  AlphaVector v_1;
  Index i_1;
  ValueFunctionPOMDPDiscrete uset2;
  AlphaVector v;
  Index i;
  AlphaVector u;
  ValueFunctionPOMDPDiscrete uset;
  ValueFunctionPOMDPDiscrete *result;
  AlphaVector *in_stack_fffffffffffffe38;
  undefined6 in_stack_fffffffffffffe40;
  byte in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  reference in_stack_fffffffffffffe48;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_fffffffffffffe50;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_fffffffffffffe88;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_fffffffffffffe90;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_fffffffffffffed8;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_stack_fffffffffffffee0;
  uint local_fc;
  undefined1 local_f8 [144];
  uint local_68;
  undefined1 local_29;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_28;
  
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_29 = 0;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x91d0db);
  while (sVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(&local_28), sVar2 != 0
        ) {
    y = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
                  ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                   (size_type)in_stack_fffffffffffffe38);
    AlphaVector::AlphaVector
              ((AlphaVector *)
               CONCAT17(in_stack_fffffffffffffe47,
                        CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
               in_stack_fffffffffffffe38);
    for (local_68 = 1; uVar3 = (ulong)local_68,
        sVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(&local_28),
        uVar3 < sVar2; local_68 = local_68 + 1) {
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
                ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 (size_type)in_stack_fffffffffffffe38);
      AlphaVector::AlphaVector
                ((AlphaVector *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 in_stack_fffffffffffffe38);
      AlphaVector::AlphaVector
                ((AlphaVector *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 in_stack_fffffffffffffe38);
      AlphaVector::AlphaVector
                ((AlphaVector *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 in_stack_fffffffffffffe38);
      bVar1 = ParetoDominates(in_RDI,y);
      AlphaVector::~AlphaVector((AlphaVector *)0x91d1da);
      AlphaVector::~AlphaVector((AlphaVector *)0x91d1e7);
      if (bVar1) {
        AlphaVector::operator=
                  (in_stack_fffffffffffffe48,
                   (AlphaVector *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
      }
      AlphaVector::~AlphaVector((AlphaVector *)0x91d2ab);
    }
    memset(local_f8,0,0x18);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x91d2f4);
    local_fc = 0;
    while( true ) {
      in_stack_fffffffffffffe50 =
           (vector<AlphaVector,_std::allocator<AlphaVector>_> *)(ulong)local_fc;
      pvVar4 = (vector<AlphaVector,_std::allocator<AlphaVector>_> *)
               std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(&local_28);
      if (pvVar4 <= in_stack_fffffffffffffe50) break;
      in_stack_fffffffffffffe48 =
           std::vector<AlphaVector,_std::allocator<AlphaVector>_>::at
                     ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)
                      CONCAT17(in_stack_fffffffffffffe47,
                               CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                      (size_type)in_stack_fffffffffffffe38);
      AlphaVector::AlphaVector
                ((AlphaVector *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 in_stack_fffffffffffffe38);
      AlphaVector::AlphaVector
                ((AlphaVector *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 in_stack_fffffffffffffe38);
      AlphaVector::AlphaVector
                ((AlphaVector *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 in_stack_fffffffffffffe38);
      in_stack_fffffffffffffe47 = ParetoDominates(in_RDI,y);
      in_stack_fffffffffffffe46 = in_stack_fffffffffffffe47 ^ 0xff;
      AlphaVector::~AlphaVector((AlphaVector *)0x91d3ab);
      AlphaVector::~AlphaVector((AlphaVector *)0x91d3b5);
      if ((in_stack_fffffffffffffe46 & 1) != 0) {
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      }
      AlphaVector::~AlphaVector((AlphaVector *)0x91d457);
      local_fc = local_fc + 1;
    }
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(in_stack_fffffffffffffe50);
    AlphaVector::~AlphaVector((AlphaVector *)0x91d4c1);
  }
  local_29 = 1;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(in_stack_fffffffffffffe50);
  return (ValueFunctionPOMDPDiscrete *)in_RDI;
}

Assistant:

ValueFunctionPOMDPDiscrete AlphaVectorPruning::ParetoPrune(const ValueFunctionPOMDPDiscrete &Vin)
{
    ValueFunctionPOMDPDiscrete uset = Vin;
    ValueFunctionPOMDPDiscrete result;
    while(uset.size()>0)
    {
        AlphaVector u = uset.at(0);
        for(Index i=1; i<uset.size();++i)
        {
            AlphaVector v = uset.at(i);
            if(ParetoDominates(v, u))
                u=v;
        }
        ValueFunctionPOMDPDiscrete uset2=ValueFunctionPOMDPDiscrete();
        for(Index i=0; i<uset.size();++i)
        {
            AlphaVector v = uset.at(i);
            if(!ParetoDominates(u, v))
                uset2.push_back(v);
        }
        result.push_back(u);
        uset=uset2;
    }

    return(result);
}